

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O0

void Am_Choice_Command_Undo_proc(Am_Object *command_obj)

{
  Am_Value local_28;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *command_obj_local;
  
  local_10 = command_obj;
  Am_Object::Am_Object(&local_18,command_obj);
  Am_Value::Am_Value(&local_28,0);
  choice_general_undo_redo(&local_18,true,false,false,&local_28);
  Am_Value::~Am_Value(&local_28);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_Command_Undo,
                 (Am_Object command_obj))
{
  choice_general_undo_redo(command_obj, true, false, false, (0L));
}